

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

string * __thiscall AmpIO::ExplainSiFault_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  char *pcVar5;
  uint i;
  ulong uVar6;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar3 != 0x64524131) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Not a Si controller",(allocator<char> *)local_1b8);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar1 = this->ReadBuffer[1];
  poVar4 = std::operator<<(local_1a8,"Explaining faults in the Si controller:");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(local_1a8);
  poVar4 = std::operator<<(local_1a8,"1. Interlocks that are preventing the axis from turning on:");
  std::endl<char,std::char_traits<char>>(poVar4);
  if ((uVar1 & 1) == 0) {
    pcVar5 = "ESPM->dVRK communication failed. Robot not programmed? Cables?";
  }
  else {
    if ((uVar1 & 2) != 0) goto LAB_0010d3bc;
    pcVar5 = "ESII/CC->ESPM communication failed. The problem is inside the robot.";
  }
  poVar4 = std::operator<<(local_1a8,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010d3bc:
  if ((uVar1 & 8) == 0) {
    poVar4 = std::operator<<(local_1a8,
                             "Encoder preload is out of sync. You must preload encoder at least once."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  bVar2 = GetPowerStatus(this,0);
  if (!bVar2) {
    poVar4 = std::operator<<(local_1a8,"48V bad. E-stop pressed?");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((*(byte *)((long)this->ReadBuffer + 6) & 0x80) != 0) {
    poVar4 = std::operator<<(local_1a8,"Watchdog timeout.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<(local_1a8,"(end)");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(local_1a8);
  poVar4 = std::operator<<(local_1a8,"2. Amps that are in fault state:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar6 = 0; uVar6 < this->NumMotors; uVar6 = uVar6 + 1) {
    uVar3 = GetAmpFaultCode(this,(uint)uVar6);
    if (uVar3 != 0) {
      poVar4 = std::operator<<(local_1a8,"Amp ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,&DAT_00118390 + *(int *)(&DAT_00118390 + (ulong)uVar3 * 4));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  poVar4 = std::operator<<(local_1a8,"(end)");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(local_1a8);
  std::endl<char,std::char_traits<char>>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ExplainSiFault() const
{
    if (GetHardwareVersion() != dRA1_String) {
        return "Not a Si controller";
    }
    std::stringstream ss;
    const char* amp_fault_text[16] = {"-", "ADC saturated", "Current deviation", "HW overcurrent", "HW overtemp", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined"};
    uint32_t status = GetStatus();
    ss << "Explaining faults in the Si controller:" << std::endl;
    ss << std::endl;
    ss << "1. Interlocks that are preventing the axis from turning on:" << std::endl;
    if (!(status & (1 << 0))) ss << "ESPM->dVRK communication failed. Robot not programmed? Cables?" << std::endl;
    if ((status & (1 << 0)) && !(status & (1 << 1))) ss << "ESII/CC->ESPM communication failed. The problem is inside the robot." << std::endl;
    if (!(status & (1 << 3))) ss << "Encoder preload is out of sync. You must preload encoder at least once." << std::endl;
    if (!GetPowerStatus()) ss << "48V bad. E-stop pressed?" << std::endl;
    if (GetWatchdogTimeoutStatus()) ss << "Watchdog timeout." << std::endl;
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << "2. Amps that are in fault state:" << std::endl;
    for (unsigned int i = 0; i < NumMotors; i++) {
        // std::cout << NumMotors << std::endl;
        uint32_t amp_fault = GetAmpFaultCode(i);
        // std::cout << amp_fault << std::endl;
        if (amp_fault) {
            ss << "Amp " << i << ": " << amp_fault_text[amp_fault] << std::endl;
        }
    }
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << std::endl;
    return ss.str();
}